

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O0

void __thiscall NaDynAr<char_*>::item::~item(item *this)

{
  long *in_RDI;
  
  if (*in_RDI == 0) {
    NaPrintLog("data=0x%08p removed twice\n",*in_RDI);
  }
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete((void *)*in_RDI,8);
  }
  *in_RDI = 0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }